

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_flip_inplace_closed
               (roaring_bitmap_t *x1,uint32_t range_start,uint32_t range_end)

{
  ushort uVar1;
  uint16_t *puVar2;
  rle16_t *prVar3;
  run_container_t *c;
  _Bool _Var4;
  int iVar5;
  array_container_t *src;
  run_container_t *prVar6;
  uint uVar7;
  uint16_t lb_start;
  uint uVar8;
  uint8_t uVar9;
  uint8_t type;
  uint uVar10;
  ushort key;
  uint uVar11;
  bool bVar12;
  uint8_t local_43;
  uint16_t local_42;
  run_container_t *local_40;
  uint local_38;
  uint local_34;
  uint16_t hb;
  
  if (range_start <= range_end) {
    uVar11 = range_start >> 0x10;
    uVar10 = range_end >> 0x10;
    lb_start = (uint16_t)range_start;
    local_42 = (uint16_t)range_end;
    hb = (uint16_t)(range_start >> 0x10);
    if (uVar11 == uVar10) {
      inplace_flip_container(&x1->high_low_container,hb,lb_start,local_42);
      return;
    }
    if (lb_start != 0) {
      inplace_flip_container(&x1->high_low_container,hb,lb_start,0xffff);
      uVar11 = uVar11 + 1 & 0xffff;
    }
    local_34 = range_end & 0xffff;
    local_38 = uVar10 + 0xffff;
    uVar7 = local_38 & 0xffff;
    if (local_34 == 0xffff) {
      uVar7 = uVar10;
    }
    if (uVar11 <= uVar7) {
      do {
        iVar5 = (x1->high_low_container).size;
        key = (ushort)uVar11;
        if (((long)iVar5 == 0) ||
           (puVar2 = (x1->high_low_container).keys, puVar2[(long)iVar5 + -1] == key)) {
          uVar10 = iVar5 - 1;
LAB_00108b2f:
          if ((int)uVar10 < 0) goto LAB_00108c7b;
LAB_00108b38:
          local_43 = (x1->high_low_container).typecodes[uVar10 & 0xffff];
          src = (array_container_t *)(x1->high_low_container).containers[uVar10 & 0xffff];
          if (local_43 == '\x04') {
            src = (array_container_t *)
                  shared_container_extract_copy((shared_container_t *)src,&local_43);
          }
          local_40 = (run_container_t *)0x0;
          if (local_43 == '\x03') {
            iVar5 = run_container_negation_inplace((run_container_t *)src,&local_40);
            uVar9 = (uint8_t)iVar5;
            prVar6 = local_40;
            type = uVar9;
            if (uVar9 == '\x04') {
              uVar9 = *(uint8_t *)&local_40->runs;
              prVar6 = *(run_container_t **)local_40;
              type = '\x04';
            }
          }
          else if (local_43 == '\x02') {
            local_40 = (run_container_t *)bitset_container_create();
            array_container_negation(src,(bitset_container_t *)local_40);
            array_container_free(src);
            uVar9 = '\x01';
            prVar6 = local_40;
            type = uVar9;
          }
          else {
            _Var4 = bitset_container_negation_inplace((bitset_container_t *)src,&local_40);
            uVar9 = '\x02' - _Var4;
            prVar6 = local_40;
            type = uVar9;
          }
          c = local_40;
          if (uVar9 == '\x03') {
            iVar5 = run_container_cardinality(prVar6);
          }
          else {
            iVar5 = prVar6->n_runs;
          }
          if (iVar5 == 0) {
            container_free(c,type);
            ra_remove_at_index(&x1->high_low_container,uVar10);
          }
          else {
            (x1->high_low_container).containers[uVar10] = c;
            (x1->high_low_container).typecodes[uVar10] = type;
          }
        }
        else {
          if (0 < iVar5) {
            iVar5 = iVar5 + -1;
            uVar8 = 0;
            do {
              uVar10 = iVar5 + uVar8 >> 1;
              uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar5 + uVar8 & 0xfffffffe));
              if (uVar1 < key) {
                uVar8 = uVar10 + 1;
              }
              else {
                if (uVar1 <= key) goto LAB_00108b38;
                iVar5 = uVar10 - 1;
              }
            } while ((int)uVar8 <= iVar5);
            uVar10 = ~uVar8;
            goto LAB_00108b2f;
          }
          uVar10 = 0xffffffff;
LAB_00108c7b:
          prVar6 = run_container_create_given_capacity(1);
          if (prVar6 != (run_container_t *)0x0) {
            prVar3 = prVar6->runs;
            iVar5 = prVar6->n_runs;
            prVar3[iVar5].value = 0;
            prVar3[iVar5].length = 0xffff;
            prVar6->n_runs = prVar6->n_runs + 1;
          }
          ra_insert_new_key_value_at(&x1->high_low_container,~uVar10,key,prVar6,'\x03');
        }
        bVar12 = uVar11 != uVar7;
        uVar11 = uVar11 + 1;
      } while (bVar12);
    }
    if (local_34 != 0xffff) {
      inplace_flip_container(&x1->high_low_container,(short)local_38 + 1,0,local_42);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_flip_inplace_closed(roaring_bitmap_t *x1,
                                        uint32_t range_start,
                                        uint32_t range_end) {
    if (range_start > range_end) {
        return;  // empty range
    }

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;
    uint16_t hb_end = (uint16_t)(range_end >> 16);
    const uint16_t lb_end = (uint16_t)range_end;

    if (hb_start == hb_end) {
        inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                               lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                                   0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            inplace_fully_flip_container(&x1->high_low_container, (uint16_t)hb);
        }
        // handle a partial final container
        if (lb_end != 0xFFFF) {
            inplace_flip_container(&x1->high_low_container, hb_end + 1, 0,
                                   lb_end);
            ++hb_end;
        }
    }
}